

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O2

SRC_ERROR sinc_quad_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  float fVar1;
  float fVar2;
  int iVar3;
  SINC_FILTER *filter;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  int ch;
  SRC_ERROR SVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int half_filter_chan_len;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int divisor;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_78 [9];
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar7 = SRC_ERR_NO_PRIVATE;
  }
  else {
    iVar14 = state->channels;
    uVar13 = (ulong)iVar14;
    filter->in_count = data->input_frames * uVar13;
    lVar16 = data->output_frames * uVar13;
    filter->out_count = lVar16;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar23 = state->last_ratio;
    SVar7 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar23) && (dVar23 <= 256.0)) {
      dVar21 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
      dVar22 = dVar23;
      if (data->src_ratio <= dVar23) {
        dVar22 = data->src_ratio;
      }
      dVar24 = state->last_position;
      half_filter_chan_len =
           ((int)ROUND((double)(-(ulong)(dVar22 < 1.0) & (ulong)(dVar21 / dVar22) |
                               ~-(ulong)(dVar22 < 1.0) & (ulong)dVar21)) + 1) * iVar14;
      dVar22 = dVar24 - (double)(int)ROUND(dVar24);
      dVar21 = (double)(~-(ulong)(dVar22 < 0.0) & (ulong)dVar22 |
                       (ulong)(dVar22 + 1.0) & -(ulong)(dVar22 < 0.0));
      iVar18 = filter->b_len;
      lVar17 = (long)((int)ROUND(dVar24 - dVar21) * iVar14 + filter->b_current) % (long)iVar18;
      dVar22 = 1.0 / dVar23;
      filter->b_current = (int)lVar17;
      lVar15 = 0;
      while (iVar14 = (int)lVar17, lVar15 < lVar16) {
        if (((filter->b_end - iVar14) + iVar18) % iVar18 <= half_filter_chan_len) {
          SVar7 = prepare_data(filter,(int)uVar13,data,half_filter_chan_len);
          state->error = SVar7;
          if (SVar7 != SRC_ERR_NO_ERROR) {
            return SVar7;
          }
          iVar14 = filter->b_current;
          if (((filter->b_end - iVar14) + filter->b_len) % filter->b_len <= half_filter_chan_len)
          break;
        }
        if ((-1 < filter->b_real_end) &&
           ((double)filter->b_real_end <= (double)iVar14 + dVar21 + dVar22 + 1e-20)) break;
        if (filter->out_count < 1) {
          lVar16 = filter->out_gen;
        }
        else {
          dVar24 = state->last_ratio;
          lVar16 = filter->out_gen;
          if (1e-10 < ABS(dVar24 - data->src_ratio)) {
            dVar23 = ((data->src_ratio - dVar24) * (double)lVar16) / (double)filter->out_count +
                     dVar24;
          }
        }
        iVar3 = filter->index_inc;
        dVar24 = dVar23;
        if (1.0 <= dVar23) {
          dVar24 = 1.0;
        }
        dVar24 = dVar24 * (double)iVar3;
        divisor = (int)ROUND(dVar24 * 4096.0);
        iVar19 = (int)ROUND(dVar21 * dVar24 * 4096.0);
        iVar18 = state->channels;
        pfVar4 = data->data_out;
        iVar8 = filter->coeff_half_len * 0x1000;
        iVar9 = (iVar8 - iVar19) / divisor;
        uVar12 = iVar9 * divisor + iVar19;
        uVar20 = iVar14 - iVar9 * iVar18;
        if ((int)uVar20 < 0) {
          uVar10 = int_div_ceil(-uVar20,4);
          uVar11 = int_div_ceil(uVar12,divisor);
          if (uVar11 < uVar10) {
            __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x2b8,
                          "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          uVar12 = uVar12 - uVar10 * divisor;
          uVar20 = uVar20 + uVar10 * 4;
        }
        uVar13 = (ulong)uVar20;
        local_78[6] = 0.0;
        local_78[7] = 0.0;
        local_78[4] = 0.0;
        local_78[5] = 0.0;
        lVar17 = uVar13 * 4;
        for (; -1 < (int)uVar12; uVar12 = uVar12 - divisor) {
          uVar10 = uVar12 >> 0xc;
          if (filter->coeff_half_len < (int)uVar10) {
            __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x2c0,
                          "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          if (((int)uVar20 < 0) || (iVar14 = (int)uVar13 + 3, filter->b_len <= iVar14)) {
            __assert_fail("data_index >= 0 && data_index + 3 < filter->b_len",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x2c2,
                          "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          if (filter->b_end <= iVar14) {
            __assert_fail("data_index + 3 < filter->b_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x2c3,
                          "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          fVar1 = filter->coeffs[uVar10];
          fVar2 = filter->coeffs[(ulong)uVar10 + 1];
          pfVar5 = filter->buffer;
          for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
            local_78[lVar15 + 4] =
                 (double)*(float *)((long)pfVar5 + lVar15 * 4 + lVar17) *
                 ((double)(uVar12 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                 (double)fVar1) + local_78[lVar15 + 4];
          }
          uVar13 = uVar13 + 4;
          lVar17 = lVar17 + 0x10;
        }
        iVar8 = (iVar8 - (divisor - iVar19)) / divisor;
        iVar14 = filter->b_current;
        uVar12 = (iVar8 + 1) * iVar18 + iVar14;
        local_78[2] = 0.0;
        local_78[3] = 0.0;
        local_78[0] = 0.0;
        local_78[1] = 0.0;
        uVar20 = iVar8 * divisor + (divisor - iVar19);
        do {
          uVar10 = (int)uVar20 >> 0xc;
          if (((int)uVar10 < 0) || (filter->coeff_half_len < (int)uVar10)) {
            __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x2d5,
                          "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          if ((int)uVar12 < 0) {
LAB_00105221:
            __assert_fail("data_index >= 0 && data_index + 3 < filter->b_len",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x2d7,
                          "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          iVar18 = filter->b_len;
          if (iVar18 <= (int)(uVar12 + 3)) goto LAB_00105221;
          if (filter->b_end <= (int)(uVar12 + 3)) {
            __assert_fail("data_index + 3 < filter->b_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x2d8,
                          "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          fVar1 = filter->coeffs[uVar10];
          fVar2 = filter->coeffs[(ulong)uVar10 + 1];
          pfVar5 = filter->buffer;
          for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
            local_78[lVar17] =
                 (double)pfVar5[(ulong)uVar12 + lVar17] *
                 ((double)(uVar20 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                 (double)fVar1) + local_78[lVar17];
          }
          uVar12 = uVar12 - 4;
          uVar10 = uVar20 - divisor;
          bVar6 = divisor <= (int)uVar20;
          uVar20 = uVar10;
        } while (uVar10 != 0 && bVar6);
        for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
          pfVar4[lVar16 + lVar17] =
               (float)((local_78[lVar17 + 4] + local_78[lVar17]) * (dVar24 / (double)iVar3));
        }
        lVar16 = filter->out_count;
        lVar15 = filter->out_gen + 4;
        dVar24 = dVar21 + 1.0 / dVar23;
        filter->out_gen = lVar15;
        dVar21 = dVar24 - (double)(int)ROUND(dVar24);
        dVar21 = (double)(~-(ulong)(dVar21 < 0.0) & (ulong)dVar21 |
                         (ulong)(dVar21 + 1.0) & -(ulong)(dVar21 < 0.0));
        uVar13 = (ulong)(uint)state->channels;
        lVar17 = (long)((int)ROUND(dVar24 - dVar21) * state->channels + iVar14) % (long)iVar18;
        filter->b_current = (int)lVar17;
      }
      state->last_position = dVar21;
      state->last_ratio = dVar23;
      iVar14 = state->channels;
      data->input_frames_used = filter->in_used / (long)iVar14;
      data->output_frames_gen = filter->out_gen / (long)iVar14;
      SVar7 = SRC_ERR_NO_ERROR;
    }
  }
  return SVar7;
}

Assistant:

SRC_ERROR
sinc_quad_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_quad (filter, state->channels, increment, start_filter_index, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += 4 ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}